

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

void __thiscall QTextFramePrivate::remove_me(QTextFramePrivate *this)

{
  long lVar1;
  undefined8 *puVar2;
  QTextObject *object;
  QTextFrame *pQVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long unaff_R12;
  ulong uVar8;
  QPodArrayOps<QTextFrame*> *this_00;
  long in_FS_OFFSET;
  QTextFrame *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  object = *(QTextObject **)&(this->super_QTextObjectPrivate).field_0x8;
  pQVar3 = this->parentFrame;
  if (pQVar3 == (QTextFrame *)0x0 &&
      (this->fragment_end == 0 && *(int *)&(this->super_QTextObjectPrivate).field_0x84 == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextDocumentPrivate::deleteObject
                (*(QTextDocumentPrivate **)(*(long *)(*(long *)&object->field_0x8 + 0x10) + 8),
                 object);
      return;
    }
    goto LAB_00534eac;
  }
  if (pQVar3 != (QTextFrame *)0x0) {
    lVar4 = *(long *)&(pQVar3->super_QTextObject).field_0x8;
    lVar5 = *(long *)(lVar4 + 0xa8);
    if (lVar5 == 0) {
LAB_00534de7:
      iVar7 = -1;
    }
    else {
      lVar6 = -8;
      do {
        iVar7 = (int)unaff_R12;
        lVar1 = lVar5 * -8 + lVar6;
        if (lVar1 == -8) goto LAB_00534de1;
        unaff_R12 = lVar6 + 8;
        puVar2 = (undefined8 *)(*(long *)(lVar4 + 0xa0) + 8 + lVar6);
        lVar6 = unaff_R12;
      } while ((QTextObject *)*puVar2 != object);
      iVar7 = (int)(unaff_R12 >> 3);
LAB_00534de1:
      if (lVar1 == -8) goto LAB_00534de7;
    }
    if ((this->childFrames).d.size != 0) {
      uVar8 = 0;
      do {
        this_00 = (QPodArrayOps<QTextFrame*> *)
                  (*(long *)&(this->parentFrame->super_QTextObject).field_0x8 + 0x98);
        pQVar3 = (this->childFrames).d.ptr[uVar8];
        local_40 = pQVar3;
        QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                  (this_00,(long)iVar7 + uVar8,&local_40);
        QList<QTextFrame_*>::begin((QList<QTextFrame_*> *)this_00);
        *(QTextFrame **)(*(long *)&(pQVar3->super_QTextObject).field_0x8 + 0x90) = this->parentFrame
        ;
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(this->childFrames).d.size);
      iVar7 = iVar7 + (int)uVar8;
    }
    QList<QTextFrame_*>::removeAt
              ((QList<QTextFrame_*> *)
               (*(long *)&(this->parentFrame->super_QTextObject).field_0x8 + 0x98),(long)iVar7);
    QList<QTextFrame_*>::clear(&this->childFrames);
    this->parentFrame = (QTextFrame *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00534eac:
  __stack_chk_fail();
}

Assistant:

void QTextFramePrivate::remove_me()
{
    Q_Q(QTextFrame);
    if (fragment_start == 0 && fragment_end == 0
        && !parentFrame) {
        QTextDocumentPrivate::get(q->document())->deleteObject(q);
        return;
    }

    if (!parentFrame)
        return;

    int index = parentFrame->d_func()->childFrames.indexOf(q);

    // iterator over all children and move them to the parent
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *c = childFrames.at(i);
        parentFrame->d_func()->childFrames.insert(index, c);
        c->d_func()->parentFrame = parentFrame;
        ++index;
    }
    Q_ASSERT(parentFrame->d_func()->childFrames.at(index) == q);
    parentFrame->d_func()->childFrames.removeAt(index);

    childFrames.clear();
    parentFrame = nullptr;
}